

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O3

int lws_header_table_detach(lws *wsi,int autoservice)

{
  lws **pplVar1;
  char cVar2;
  allocated_headers *ah;
  lws_context *plVar3;
  lws **pplVar4;
  int iVar5;
  lws **pplVar6;
  lws *plVar7;
  lws **pplVar8;
  long lStack_48;
  lws_pollargs lStack_3c;
  
  ah = (wsi->http).ah;
  plVar3 = wsi->context;
  cVar2 = wsi->tsi;
  __lws_remove_from_ah_waiting_list(wsi);
  if (ah == (allocated_headers *)0x0) {
    return 0;
  }
  _lws_log(8,"%s: wsi %p: ah %p (tsi=%d, count = %d)\n","__lws_header_table_detach",wsi,ah,
           (ulong)(uint)(int)wsi->tsi,
           *(undefined4 *)((long)&plVar3->set + (long)cVar2 * 0x188 + -0x60));
  time(&lStack_48);
  if ((ah->assigned != 0) && (lStack_48 = lStack_48 - ah->assigned, 3 < lStack_48)) {
    _lws_log(0x10,"%s: wsi %p: ah held %ds, role/state 0x%lx 0x%x,\n","__lws_header_table_detach",
             wsi,lStack_48,(ulong)(wsi->wsistate & 0xffff0000),wsi->wsistate & 0xffff);
  }
  ah->assigned = 0;
  if (*(int *)((long)&plVar3->set + (long)cVar2 * 0x188 + -0x60) < 1) {
    __assert_fail("pt->http.ah_count_in_use > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/http/parsers.c"
                  ,0x156,"int __lws_header_table_detach(struct lws *, int)");
  }
  if (ah->in_use == '\0') {
    __assert_fail("ah->in_use",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/http/parsers.c"
                  ,0x158,"int __lws_header_table_detach(struct lws *, int)");
  }
  ah->wsi = (lws *)0x0;
  (wsi->http).ah = (allocated_headers *)0x0;
  if (*(long *)((long)&plVar3->set + (long)cVar2 * 0x188 + -0x70) != 0) {
    pplVar1 = (lws **)((long)&plVar3->set + (long)cVar2 * 0x188 + -0x70);
    _lws_log(8,"pt wait list %p\n");
    pplVar4 = (lws **)0x0;
    pplVar8 = pplVar1;
    plVar7 = (lws *)0x0;
    do {
      wsi = plVar7;
      pplVar6 = pplVar4;
      plVar7 = *pplVar8;
      pplVar4 = pplVar8;
      pplVar8 = &(plVar7->http).ah_wait_list;
    } while (plVar7 != (lws *)0x0);
    if (wsi != (lws *)0x0) {
      _lws_log(8,"%s: transferring ah to last eligible wsi in wait list %p (wsistate 0x%lx)\n",
               "__lws_header_table_detach",wsi,(ulong)wsi->wsistate);
      (wsi->http).ah = ah;
      ah->wsi = wsi;
      __lws_header_table_reset(wsi,autoservice);
      if (wsi->position_in_fds_table != -1) {
        _lws_log(8,"%s: Enabling %p POLLIN\n","__lws_header_table_detach",wsi);
        _lws_change_pollfd(wsi,0,1,&lStack_3c);
      }
      *pplVar6 = (wsi->http).ah_wait_list;
      (wsi->http).ah_wait_list = (lws *)0x0;
      iVar5 = *(int *)((long)&plVar3->set + (long)cVar2 * 0x188 + -0x68) + -1;
      *(int *)((long)&plVar3->set + (long)cVar2 * 0x188 + -0x68) = iVar5;
      if ((wsi->wsistate & 0x1000ffff) == 0x10000200) {
        plVar7 = lws_http_client_connect_via_info2(wsi);
        return -(uint)(plVar7 == (lws *)0x0);
      }
      if ((iVar5 != 0) == (*pplVar1 == (lws *)0x0)) {
        __assert_fail("!!pt->http.ah_wait_list_length == !!(lws_intptr_t)pt->http.ah_wait_list",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/http/parsers.c"
                      ,0x1b5,"int __lws_header_table_detach(struct lws *, int)");
      }
      iVar5 = *(int *)((long)&plVar3->set + (long)cVar2 * 0x188 + -0x60);
      goto LAB_0011f351;
    }
    wsi = (lws *)0x0;
  }
  _lws_log(8,"%s: nobody usable waiting\n","__lws_header_table_detach");
  _lws_destroy_ah(plVar3->pt + cVar2,ah);
  iVar5 = *(int *)((long)&plVar3->set + (long)cVar2 * 0x188 + -0x60) + -1;
  *(int *)((long)&plVar3->set + (long)cVar2 * 0x188 + -0x60) = iVar5;
LAB_0011f351:
  _lws_log(8,"%s: wsi %p: ah %p (tsi=%d, count = %d)\n","__lws_header_table_detach",wsi,ah,
           (ulong)*(byte *)((long)&plVar3->set + (long)cVar2 * 0x188 + -0x42),iVar5);
  return 0;
}

Assistant:

int lws_header_table_detach(struct lws *wsi, int autoservice)
{
	struct lws_context *context = wsi->context;
	struct lws_context_per_thread *pt = &context->pt[(int)wsi->tsi];
	int n;

	lws_pt_lock(pt, __func__);
	n = __lws_header_table_detach(wsi, autoservice);
	lws_pt_unlock(pt);

	return n;
}